

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::ExternalCommand::canUpdateIfNewerWithResult
          (ExternalCommand *this,BuildValue *result)

{
  bool bVar1;
  uint uVar2;
  FileInfo *this_00;
  FileInfo *outputInfo;
  uint e;
  uint i;
  BuildValue *result_local;
  ExternalCommand *this_local;
  
  if ((this->allowModifiedOutputs & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    outputInfo._4_4_ = 0;
    uVar2 = BuildValue::getNumOutputs(result);
    for (; outputInfo._4_4_ != uVar2; outputInfo._4_4_ = outputInfo._4_4_ + 1) {
      this_00 = BuildValue::getNthOutputInfo(result,outputInfo._4_4_);
      bVar1 = basic::FileInfo::isMissing(this_00);
      if (bVar1) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ExternalCommand::canUpdateIfNewerWithResult(const BuildValue& result) {
  // Unless `allowModifiedOutputs` is specified, we always need to update if
  // ran.
  if (!allowModifiedOutputs)
    return false;

  // If it was specified, then we can update if all of our outputs simply exist.
  for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
    const FileInfo& outputInfo = result.getNthOutputInfo(i);

    // If the output is missing, we need to rebuild.
    if (outputInfo.isMissing())
      return false;
  }
  return true;
}